

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O0

Packet * __thiscall mognetwork::Packet::operator<<(Packet *this,char *data)

{
  undefined4 uVar1;
  size_t sVar2;
  Packet *in_RSI;
  Packet *in_RDI;
  int32_t size;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  sVar2 = strlen((char *)in_RSI);
  uVar1 = (undefined4)sVar2;
  operator<<(in_RDI,in_stack_ffffffffffffffd8);
  push(in_RSI,(void *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),(uint)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

Packet& Packet::operator<<(const char* data)
  {
    int32_t size = strlen(data) * sizeof(char);
    *this << size;
    push(data, size);
    return (*this);
  }